

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O3

int Lpk_ExploreCut(Lpk_Man_t *p,Lpk_Cut_t *pCut,Kit_DsdNtk_t *pNtk)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ushort uVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  If_Obj_t *pIVar8;
  Abc_Obj_t *pAVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  Vec_Vec_t *vLevels;
  If_Man_t *pIVar13;
  Abc_Obj_t *pObj;
  uint uVar14;
  long lVar15;
  uint uVar16;
  timespec ts;
  If_Obj_t *ppLeaves [16];
  timespec local_d8;
  If_Obj_t *local_c8;
  If_Obj_t *local_c0;
  If_Obj_t *local_b8 [17];
  
  uVar4 = pNtk->Root;
  if ((uint)pNtk->nNodes + (uint)pNtk->nVars <= (uint)(uVar4 >> 1)) {
    __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kit.h"
                  ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
  }
  uVar11 = (uint)*pNtk->pNodes[(ulong)(uint)(uVar4 >> 1) - (ulong)pNtk->nVars] >> 6 & 7;
  if (uVar11 - 3 < 3) {
    pIVar13 = p->pIfMan;
    if (pIVar13 == (If_Man_t *)0x0) {
      Lpk_IfManStart(p);
      pIVar13 = p->pIfMan;
    }
    If_ManRestart(pIVar13);
    if (0 < p->pPars->nVarsMax) {
      lVar15 = 0;
      do {
        pIVar8 = If_ManCreateCi(p->pIfMan);
        local_b8[lVar15] = pIVar8;
        lVar15 = lVar15 + 1;
      } while (lVar15 < p->pPars->nVarsMax);
    }
    if ((undefined1  [212])((undefined1  [212])*pCut & (undefined1  [212])0x3f) ==
        (undefined1  [212])0x0) {
      pIVar13 = p->pIfMan;
    }
    else {
      pVVar5 = p->pNtk->vObjs;
      uVar10 = 0;
      do {
        iVar7 = pCut->pLeaves[uVar10];
        if (((long)iVar7 < 0) || (pVVar5->nSize <= iVar7)) goto LAB_0048c6e5;
        pIVar13 = p->pIfMan;
        pIVar13->pPars->pTimesArr[uVar10] =
             (float)(*(uint *)((long)pVVar5->pArray[iVar7] + 0x14) >> 0xc);
        uVar10 = uVar10 + 1;
      } while (uVar10 < (*(uint *)pCut & 0x3f));
    }
    If_ManSetupCiCutSets(pIVar13);
    p->fCalledOnce = 0;
    p->nCalledSRed = 0;
    local_c0 = Lpk_MapTree_rec(p,pNtk,local_b8,(uint)pNtk->Root,(If_Obj_t *)0x0);
    if (local_c0 == (If_Obj_t *)0x0) {
      return 0;
    }
    local_c8 = (If_Obj_t *)((ulong)local_c0 & 0xfffffffffffffffe);
    If_ManCreateCo(p->pIfMan,local_c8);
    p->pIfMan->pPars->fAreaOnly = 1;
    iVar7 = clock_gettime(3,&local_d8);
    if (iVar7 < 0) {
      lVar15 = 1;
    }
    else {
      lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_d8.tv_nsec),8);
      lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_d8.tv_sec * -1000000;
    }
    If_ManPerformMappingComb(p->pIfMan);
    iVar7 = clock_gettime(3,&local_d8);
    if (iVar7 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = local_d8.tv_nsec / 1000 + local_d8.tv_sec * 1000000;
    }
    p->timeMap = p->timeMap + lVar12 + lVar15;
    uVar11 = (*(uint *)pCut >> 6 & 0x3f) - (*(uint *)pCut >> 0xc & 0x3f);
    uVar16 = (uint)p->pIfMan->AreaGlo;
    uVar14 = uVar11 - uVar16;
    if (p->pPars->fVeryVerbose != 0) {
      printf("       Mffc = %2d. Mapped = %2d. Gain = %3d. Depth increase = %d. SReds = %d.\n",
             (ulong)uVar11,(ulong)uVar16,(ulong)uVar14,
             (ulong)((int)p->pIfMan->RequiredGlo - (*(uint *)&p->pObj->field_0x14 >> 0xc)),
             (ulong)(uint)p->nCalledSRed);
    }
    if ((int)uVar14 < 1) {
      if (p->pPars->fZeroCost == 0) {
        return 0;
      }
      if (uVar11 != uVar16) {
        return 0;
      }
    }
    fVar1 = p->pIfMan->RequiredGlo;
    iVar7 = Abc_ObjRequiredLevel(p->pObj);
    if (iVar7 < (int)fVar1) {
      return 0;
    }
    uVar2 = p->nGainTotal;
    uVar3 = p->nChanges;
    p->nGainTotal = uVar14 + uVar2;
    p->nChanges = uVar3 + 1;
    if (p->nCalledSRed != 0) {
      p->nBenefited = p->nBenefited + 1;
    }
    If_ManCleanNodeCopy(p->pIfMan);
    If_ManCleanCutData(p->pIfMan);
    if ((undefined1  [212])((undefined1  [212])*pCut & (undefined1  [212])0x3f) !=
        (undefined1  [212])0x0) {
      uVar10 = 0;
      do {
        iVar7 = pCut->pLeaves[uVar10];
        if ((((long)iVar7 < 0) || (pVVar5 = p->pNtk->vObjs, pVVar5->nSize <= iVar7)) ||
           (pVVar6 = p->pIfMan->vCis, (long)pVVar6->nSize <= (long)uVar10)) goto LAB_0048c6e5;
        *(void **)((long)pVVar6->pArray[uVar10] + 0x40) = pVVar5->pArray[iVar7];
        uVar10 = uVar10 + 1;
      } while (uVar10 < (*(uint *)pCut & 0x3f));
    }
    pAVar9 = Abc_NodeFromIf_rec(p->pNtk,p->pIfMan,local_c8,p->vCover);
    (pAVar9->field_5).pData = (void *)((ulong)(pAVar9->field_5).pData ^ (ulong)((uint)local_c0 & 1))
    ;
    Abc_NtkUpdate(p->pObj,pAVar9,p->vLevels);
  }
  else {
    if (uVar11 == 2) {
      uVar11 = (uint)*(ushort *)(pNtk->pNodes[(ulong)(uint)(uVar4 >> 1) - (ulong)pNtk->nVars] + 1);
      iVar7 = *(int *)((long)pCut->pLeaves + (ulong)(uVar11 & 0xfffffffe) * 2);
      if ((long)iVar7 < 0) {
LAB_0048c6e5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pVVar5 = p->pNtk->vObjs;
      if (pVVar5->nSize <= iVar7) goto LAB_0048c6e5;
      pAVar9 = (Abc_Obj_t *)pVVar5->pArray[iVar7];
      if ((uVar11 & 1) != (uVar4 & 1)) {
        pAVar9 = Abc_NtkCreateNodeInv(p->pNtk,pAVar9);
      }
      pObj = p->pObj;
      vLevels = p->vLevels;
    }
    else {
      if (uVar11 != 1) {
        __assert_fail("pRoot->Type == KIT_DSD_AND || pRoot->Type == KIT_DSD_XOR || pRoot->Type == KIT_DSD_PRIME"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkCore.c"
                      ,0xa1,"int Lpk_ExploreCut(Lpk_Man_t *, Lpk_Cut_t *, Kit_DsdNtk_t *)");
      }
      if ((uVar4 & 1) == 0) {
        pAVar9 = Abc_NtkCreateNodeConst1(p->pNtk);
      }
      else {
        pAVar9 = Abc_NtkCreateNodeConst0(p->pNtk);
      }
      pObj = p->pObj;
      vLevels = p->vLevels;
    }
    Abc_NtkUpdate(pObj,pAVar9,vLevels);
    p->nGainTotal = (p->nGainTotal - (*(uint *)pCut >> 0xc & 0x3f)) + (*(uint *)pCut >> 6 & 0x3f);
  }
  return 1;
}

Assistant:

int Lpk_ExploreCut( Lpk_Man_t * p, Lpk_Cut_t * pCut, Kit_DsdNtk_t * pNtk )
{
    extern Abc_Obj_t * Abc_NodeFromIf_rec( Abc_Ntk_t * pNtkNew, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Int_t * vCover );
    Kit_DsdObj_t * pRoot;
    If_Obj_t * pDriver, * ppLeaves[16];
    Abc_Obj_t * pLeaf, * pObjNew;
    int nGain, i;
    abctime clk;
    int nNodesBef;
//    int nOldShared;

    // check special cases
    pRoot = Kit_DsdNtkRoot( pNtk );
    if ( pRoot->Type == KIT_DSD_CONST1 )
    {
        if ( Abc_LitIsCompl(pNtk->Root) )
            pObjNew = Abc_NtkCreateNodeConst0( p->pNtk );
        else
            pObjNew = Abc_NtkCreateNodeConst1( p->pNtk );
        Abc_NtkUpdate( p->pObj, pObjNew, p->vLevels );
        p->nGainTotal += pCut->nNodes - pCut->nNodesDup;
        return 1;
    }
    if ( pRoot->Type == KIT_DSD_VAR )
    {
        pObjNew = Abc_NtkObj( p->pNtk, pCut->pLeaves[ Abc_Lit2Var(pRoot->pFans[0]) ] );
        if ( Abc_LitIsCompl(pNtk->Root) ^ Abc_LitIsCompl(pRoot->pFans[0]) )
            pObjNew = Abc_NtkCreateNodeInv( p->pNtk, pObjNew );
        Abc_NtkUpdate( p->pObj, pObjNew, p->vLevels );
        p->nGainTotal += pCut->nNodes - pCut->nNodesDup;
        return 1;
    }
    assert( pRoot->Type == KIT_DSD_AND || pRoot->Type == KIT_DSD_XOR || pRoot->Type == KIT_DSD_PRIME );

    // start the mapping manager
    if ( p->pIfMan == NULL )
        Lpk_IfManStart( p );

    // prepare the mapping manager
    If_ManRestart( p->pIfMan );
    // create the PI variables
    for ( i = 0; i < p->pPars->nVarsMax; i++ )
        ppLeaves[i] = If_ManCreateCi( p->pIfMan );
    // set the arrival times
    Lpk_CutForEachLeaf( p->pNtk, pCut, pLeaf, i )
        p->pIfMan->pPars->pTimesArr[i] = (float)pLeaf->Level;
    // prepare the PI cuts
    If_ManSetupCiCutSets( p->pIfMan );
    // create the internal nodes
    p->fCalledOnce = 0;
    p->nCalledSRed = 0;
    pDriver = Lpk_MapTree_rec( p, pNtk, ppLeaves, pNtk->Root, NULL );
    if ( pDriver == NULL )
        return 0;
    // create the PO node
    If_ManCreateCo( p->pIfMan, If_Regular(pDriver) );

    // perform mapping
    p->pIfMan->pPars->fAreaOnly = 1;
clk = Abc_Clock();
    If_ManPerformMappingComb( p->pIfMan );
p->timeMap += Abc_Clock() - clk;

    // compute the gain in area
    nGain = pCut->nNodes - pCut->nNodesDup - (int)p->pIfMan->AreaGlo;
    if ( p->pPars->fVeryVerbose )
        printf( "       Mffc = %2d. Mapped = %2d. Gain = %3d. Depth increase = %d. SReds = %d.\n", 
            pCut->nNodes - pCut->nNodesDup, (int)p->pIfMan->AreaGlo, nGain, (int)p->pIfMan->RequiredGlo - (int)p->pObj->Level, p->nCalledSRed );

    // quit if there is no gain
    if ( !(nGain > 0 || (p->pPars->fZeroCost && nGain == 0)) )
        return 0;

    // quit if depth increases too much
    if ( (int)p->pIfMan->RequiredGlo > Abc_ObjRequiredLevel(p->pObj) )
        return 0;

    // perform replacement
    p->nGainTotal += nGain;
    p->nChanges++;
    if ( p->nCalledSRed )
        p->nBenefited++;

    nNodesBef = Abc_NtkNodeNum(p->pNtk);
    // prepare the mapping manager
    If_ManCleanNodeCopy( p->pIfMan );
    If_ManCleanCutData( p->pIfMan );
    // set the PIs of the cut
    Lpk_CutForEachLeaf( p->pNtk, pCut, pLeaf, i )
        If_ObjSetCopy( If_ManCi(p->pIfMan, i), pLeaf );
    // get the area of mapping
    pObjNew = Abc_NodeFromIf_rec( p->pNtk, p->pIfMan, If_Regular(pDriver), p->vCover );
    pObjNew->pData = Hop_NotCond( (Hop_Obj_t *)pObjNew->pData, If_IsComplement(pDriver) );
    // perform replacement
    Abc_NtkUpdate( p->pObj, pObjNew, p->vLevels );
//printf( "%3d : %d-%d=%d(%d) \n", p->nChanges, nNodesBef, Abc_NtkNodeNum(p->pNtk), nNodesBef-Abc_NtkNodeNum(p->pNtk), nGain );
    return 1;
}